

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

FunctionBody * __thiscall
TTD::ScriptContextTTD::FindRootBodyByTopLevelCtr(ScriptContextTTD *this,uint32 bodyCtrId)

{
  bool bVar1;
  EntryType *pEVar2;
  undefined1 local_40 [8];
  EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  iter;
  
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_40,&this->m_ttdTopLevelScriptLoad);
  while (bVar1 = JsUtil::
                 BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::IsValid((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                            *)local_40), bVar1) {
    pEVar2 = JsUtil::
             BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::
             IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ::Current((IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                        *)local_40);
    if ((pEVar2->
        super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
        super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
        .super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.value
        .TopLevelBodyCtr == bodyCtrId) goto LAB_008284ed;
    JsUtil::
    BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_40);
  }
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_40,&this->m_ttdTopLevelNewFunction);
  while (bVar1 = JsUtil::
                 BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::IsValid((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                            *)local_40), bVar1) {
    pEVar2 = JsUtil::
             BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::
             IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ::Current((IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                        *)local_40);
    if ((pEVar2->
        super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
        super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
        .super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.value
        .TopLevelBodyCtr == bodyCtrId) goto LAB_008284ed;
    JsUtil::
    BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_40);
  }
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_40,&this->m_ttdTopLevelEval);
  while( true ) {
    bVar1 = JsUtil::
            BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)local_40);
    if (!bVar1) {
      return (FunctionBody *)0x0;
    }
    pEVar2 = JsUtil::
             BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::
             IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ::Current((IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                        *)local_40);
    if ((pEVar2->
        super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
        super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
        .super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.value
        .TopLevelBodyCtr == bodyCtrId) break;
    JsUtil::
    BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_40);
  }
LAB_008284ed:
  pEVar2 = JsUtil::
           BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::
           IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
           ::Current((IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                      *)local_40);
  return (FunctionBody *)
         (pEVar2->
         super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
         super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
         .super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
         value.ContextSpecificBodyPtrId;
}

Assistant:

Js::FunctionBody* ScriptContextTTD::FindRootBodyByTopLevelCtr(uint32 bodyCtrId) const
    {
        for(auto iter = this->m_ttdTopLevelScriptLoad.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            if(iter.CurrentValue().TopLevelBodyCtr == bodyCtrId)
            {
                return TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(iter.CurrentValue().ContextSpecificBodyPtrId);
            }
        }

        for(auto iter = this->m_ttdTopLevelNewFunction.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            if(iter.CurrentValue().TopLevelBodyCtr == bodyCtrId)
            {
                return TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(iter.CurrentValue().ContextSpecificBodyPtrId);
            }
        }

        for(auto iter = this->m_ttdTopLevelEval.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            if(iter.CurrentValue().TopLevelBodyCtr == bodyCtrId)
            {
                return TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(iter.CurrentValue().ContextSpecificBodyPtrId);
            }
        }

        return nullptr;
    }